

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_JoinPsbt_Test::TestBody(cfdcapi_psbt_JoinPsbt_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t in_stack_00000288;
  uint32_t in_stack_0000028c;
  char *in_stack_00000290;
  char *in_stack_00000298;
  int in_stack_000002a4;
  void *in_stack_000002a8;
  void **in_stack_000002c0;
  bool *in_stack_fffffffffffffd98;
  AssertionResult *in_stack_fffffffffffffda0;
  CfdErrorCode *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  undefined7 in_stack_fffffffffffffe58;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  AssertionResult local_140;
  AssertHelper in_stack_fffffffffffffed0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  void *in_stack_fffffffffffffee8;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  char *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8))
  ;
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x382efa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x382f5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x382fb2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(type *)0x382fe6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(internal *)&local_60,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    testing::Message::~Message((Message *)0x3830e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38315d);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHAQMEAQAAAAEEFgAUlixOCPM206+8NBXJ01muEEBHBSAiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
  ;
  local_b8 = (char *)0x0;
  local_14 = CfdCreatePsbtHandle(in_stack_000002a8,in_stack_000002a4,in_stack_00000298,
                                 in_stack_00000290,in_stack_0000028c,in_stack_00000288,
                                 in_stack_000002c0);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x383279);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x106,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x3832dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x383334);
  if (local_14 == 0) {
    local_14 = CfdJoinPsbt((void *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68);
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar2) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x38340c);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x109,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x383469);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3834c1);
    local_14 = CfdGetPsbtData(in_stack_fffffffffffffee8,
                              (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (char **)in_stack_fffffffffffffed8.ptr_,
                              (char **)in_stack_fffffffffffffed0.data_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffee8);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffed8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x38358a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffed0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x10c,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffed0,(Message *)&stack0xfffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed0);
      testing::Message::~Message((Message *)0x3835e7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38363c);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_140,"exp_psbt_base64","output",local_b0,local_b8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      if (!bVar2) {
        testing::Message::Message(&local_148);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3836e0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x10e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        testing::Message::~Message((Message *)0x38373d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x383792);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffda8);
      local_b8 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle((void *)CONCAT17(uVar1,in_stack_fffffffffffffe58),pAVar4);
    local_164 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar2) {
      testing::Message::Message(&local_170);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x38386a);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x114,pcVar3);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message((Message *)0x3838c7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38391c);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffda8);
  local_18c = 0;
  pAVar4 = &local_188;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),&pAVar4->success_
             ,in_stack_fffffffffffffda8,(int *)in_stack_fffffffffffffda0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3839d3);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x118,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x383a30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x383a85);
  return;
}

Assistant:

TEST(cfdcapi_psbt, JoinPsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHAQMEAQAAAAEEFgAUlixOCPM206+8NBXJ01muEEBHBSAiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdJoinPsbt(handle, psbt_handle, "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}